

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

IReporter *
doctest::detail::reporterCreator<doctest::(anonymous_namespace)::JUnitReporter>(ContextOptions *o)

{
  JUnitReporter *this;
  ContextOptions *o_local;
  
  this = (JUnitReporter *)operator_new(0xd0);
  anon_unknown_14::JUnitReporter::JUnitReporter(this,o);
  return &this->super_IReporter;
}

Assistant:

IReporter* reporterCreator(const ContextOptions& o) {
        return new Reporter(o);
    }